

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int ChooseLeaf(Rtree *pRtree,RtreeCell *pCell,int iHeight,RtreeNode **ppLeaf)

{
  bool bVar1;
  RtreeDValue RVar2;
  RtreeDValue RVar3;
  RtreeDValue area;
  RtreeDValue growth;
  int bBest;
  RtreeCell *aCell;
  RtreeNode *pChild;
  RtreeCell cell;
  double dStack_58;
  int nCell;
  RtreeDValue fMinArea;
  RtreeDValue fMinGrowth;
  sqlite3_int64 iBest;
  RtreeCell *pRStack_38;
  int iCell;
  RtreeNode *pNode;
  int ii;
  int rc;
  RtreeNode **ppLeaf_local;
  RtreeCell *pRStack_18;
  int iHeight_local;
  RtreeCell *pCell_local;
  Rtree *pRtree_local;
  
  pRStack_38 = (RtreeCell *)0x0;
  _ii = ppLeaf;
  ppLeaf_local._4_4_ = iHeight;
  pRStack_18 = pCell;
  pCell_local = (RtreeCell *)pRtree;
  pNode._4_4_ = nodeAcquire(pRtree,1,(RtreeNode *)0x0,(RtreeNode **)&stack0xffffffffffffffc8);
  pNode._0_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (pNode._4_4_ == 0) {
      bVar1 = (int)pNode < pCell_local->aCoord[9].i - ppLeaf_local._4_4_;
    }
    if (!bVar1) break;
    fMinGrowth = 0.0;
    fMinArea = 0.0;
    dStack_58 = 0.0;
    cell.aCoord[9].i = readInt16(*(u8 **)(pRStack_38->aCoord + 4) + 2);
    for (iBest._4_4_ = 0; iBest._4_4_ < cell.aCoord[9].i; iBest._4_4_ = iBest._4_4_ + 1) {
      bVar1 = false;
      nodeGetCell((Rtree *)pCell_local,(RtreeNode *)pRStack_38,iBest._4_4_,(RtreeCell *)&pChild);
      RVar2 = cellGrowth((Rtree *)pCell_local,(RtreeCell *)&pChild,pRStack_18);
      RVar3 = cellArea((Rtree *)pCell_local,(RtreeCell *)&pChild);
      if (((iBest._4_4_ == 0) || (RVar2 < fMinArea)) ||
         ((RVar2 == fMinArea && ((!NAN(RVar2) && !NAN(fMinArea) && (RVar3 < dStack_58)))))) {
        bVar1 = true;
      }
      if (bVar1) {
        fMinGrowth = (RtreeDValue)pChild;
        dStack_58 = RVar3;
        fMinArea = RVar2;
      }
    }
    sqlite3_free((void *)0x0);
    pNode._4_4_ = nodeAcquire((Rtree *)pCell_local,(i64)fMinGrowth,(RtreeNode *)pRStack_38,
                              (RtreeNode **)&aCell);
    nodeRelease((Rtree *)pCell_local,(RtreeNode *)pRStack_38);
    pRStack_38 = aCell;
    pNode._0_4_ = (int)pNode + 1;
  }
  *_ii = (RtreeNode *)pRStack_38;
  return pNode._4_4_;
}

Assistant:

static int ChooseLeaf(
  Rtree *pRtree,               /* Rtree table */
  RtreeCell *pCell,            /* Cell to insert into rtree */
  int iHeight,                 /* Height of sub-tree rooted at pCell */
  RtreeNode **ppLeaf           /* OUT: Selected leaf page */
){
  int rc;
  int ii;
  RtreeNode *pNode = 0;
  rc = nodeAcquire(pRtree, 1, 0, &pNode);

  for(ii=0; rc==SQLITE_OK && ii<(pRtree->iDepth-iHeight); ii++){
    int iCell;
    sqlite3_int64 iBest = 0;

    RtreeDValue fMinGrowth = RTREE_ZERO;
    RtreeDValue fMinArea = RTREE_ZERO;

    int nCell = NCELL(pNode);
    RtreeCell cell;
    RtreeNode *pChild;

    RtreeCell *aCell = 0;

    /* Select the child node which will be enlarged the least if pCell
    ** is inserted into it. Resolve ties by choosing the entry with
    ** the smallest area.
    */
    for(iCell=0; iCell<nCell; iCell++){
      int bBest = 0;
      RtreeDValue growth;
      RtreeDValue area;
      nodeGetCell(pRtree, pNode, iCell, &cell);
      growth = cellGrowth(pRtree, &cell, pCell);
      area = cellArea(pRtree, &cell);
      if( iCell==0||growth<fMinGrowth||(growth==fMinGrowth && area<fMinArea) ){
        bBest = 1;
      }
      if( bBest ){
        fMinGrowth = growth;
        fMinArea = area;
        iBest = cell.iRowid;
      }
    }

    sqlite3_free(aCell);
    rc = nodeAcquire(pRtree, iBest, pNode, &pChild);
    nodeRelease(pRtree, pNode);
    pNode = pChild;
  }

  *ppLeaf = pNode;
  return rc;
}